

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

JsErrorCode
WScriptJsrt::NotifyModuleReadyCallback(JsModuleRecord referencingModule,JsValueRef exceptionVar)

{
  MessageQueue *this;
  DWORD DVar1;
  uint uVar2;
  mapped_type *pmVar3;
  ModuleMessage *pMVar4;
  JsErrorCode JVar5;
  undefined8 uVar6;
  void *local_50;
  JsValueRef specifier;
  AutoString fileName;
  JsModuleRecord referencingModule_local;
  
  fileName._24_8_ = referencingModule;
  if ((exceptionVar != (JsValueRef)0x0) && (HostConfigFlags::flags.TraceHostCallbackIsEnabled)) {
    local_50 = (JsValueRef)0x0;
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetModuleHostInfo)
              (referencingModule,JsModuleHostInfo_Url,&local_50);
    fileName.data._0_5_ = 0;
    fileName._13_8_ = 0;
    specifier = (JsValueRef)0x0;
    fileName.length._0_5_ = 0;
    fileName.length._5_3_ = 0;
    if (local_50 == (JsValueRef)0x0) {
      uVar6 = 0;
    }
    else {
      AutoString::Initialize((AutoString *)&specifier,local_50);
      uVar6 = CONCAT35(fileName.length._5_3_,(undefined5)fileName.length);
    }
    PAL_wprintf(L"NotifyModuleReadyCallback(exception) %S\n",uVar6);
    AutoString::~AutoString((AutoString *)&specifier);
  }
  pmVar3 = std::
           map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
           ::operator[](&moduleErrMap,(key_type *)&fileName.errorCode);
  JVar5 = JsNoError;
  if (*pmVar3 != ErroredModule) {
    JVar5 = JsNoError;
    pMVar4 = ModuleMessage::Create((JsModuleRecord)fileName._24_8_,(JsValueRef)0x0,(string *)0x0);
    this = messageQueue;
    if (pMVar4 == (ModuleMessage *)0x0) {
      JVar5 = JsErrorOutOfMemory;
    }
    else {
      DVar1 = GetTickCount();
      uVar2 = DVar1 + (pMVar4->super_MessageBase).m_time;
      (pMVar4->super_MessageBase).m_time = uVar2;
      specifier = (JsValueRef)CONCAT44(specifier._4_4_,uVar2);
      fileName.length._0_5_ = SUB85(pMVar4,0);
      fileName.length._5_3_ = (undefined3)((ulong)pMVar4 >> 0x28);
      SortedList<MessageQueue::ListEntry>::Insert(&this->m_queue,(ListEntry *)&specifier);
    }
  }
  return JVar5;
}

Assistant:

JsErrorCode WScriptJsrt::NotifyModuleReadyCallback(_In_opt_ JsModuleRecord referencingModule, _In_opt_ JsValueRef exceptionVar)
{
    if (exceptionVar != nullptr && HostConfigFlags::flags.TraceHostCallbackIsEnabled)
    {
        JsValueRef specifier = JS_INVALID_REFERENCE;
        ChakraRTInterface::JsGetModuleHostInfo(referencingModule, JsModuleHostInfo_Url, &specifier);
        AutoString fileName;
        if (specifier != JS_INVALID_REFERENCE)
        {
            fileName.Initialize(specifier);
        }
        wprintf(_u("NotifyModuleReadyCallback(exception) %S\n"), fileName.GetString());
    }
    
    if (moduleErrMap[referencingModule] != ErroredModule)
    {
        WScriptJsrt::ModuleMessage* moduleMessage =
            WScriptJsrt::ModuleMessage::Create(referencingModule, nullptr);
        if (moduleMessage == nullptr)
        {
            return JsErrorOutOfMemory;
        }
        WScriptJsrt::PushMessage(moduleMessage);
    }
    return JsNoError;
}